

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

int Path::mkdir(char *__path,__mode_t __mode)

{
  int iVar1;
  undefined3 uVar4;
  char *pcVar2;
  int *piVar3;
  bool local_b1;
  undefined1 local_b0 [8];
  stat s;
  int ret;
  string *path_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  s.__glibc_reserved[2]._4_4_ = ::mkdir(pcVar2,0x1e8);
  piVar3 = (int *)(ulong)s.__glibc_reserved[2]._4_4_;
  if (s.__glibc_reserved[2]._4_4_ == 0) {
    path_local._7_1_ = true;
  }
  else {
    if ((int)s.__glibc_reserved[2]._4_4_ < 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 0x11) {
        path_local._7_1_ = false;
        goto LAB_0011f806;
      }
    }
    memset(local_b0,0,0x90);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = stat(pcVar2,(stat *)local_b0);
    uVar4 = 0;
    local_b1 = false;
    if (iVar1 == 0) {
      local_b1 = ((uint)s.st_nlink & 0x4000) != 0;
      uVar4 = (undefined3)(((uint)s.st_nlink & 0x4000) >> 8);
    }
    piVar3 = (int *)(ulong)CONCAT31(uVar4,local_b1);
    path_local._7_1_ = local_b1;
  }
LAB_0011f806:
  return (int)CONCAT71((int7)((ulong)piVar3 >> 8),path_local._7_1_);
}

Assistant:

bool mkdir(const std::string &path)
{
#ifdef _WIN32
	if (!CreateDirectoryA(path.c_str(), nullptr))
	{
		if (GetLastError() != ERROR_ALREADY_EXISTS)
			return false;
		if (!is_directory(path))
			return false;
	}
	return true;
#else
	int ret = ::mkdir(path.c_str(), 0750);
	if (ret == 0)
		return true;
	if (ret < 0 && errno != EEXIST)
		return false;

	// Verify the path is actually a directory.
	struct stat s = {};
	return ::stat(path.c_str(), &s) == 0 && (s.st_mode & S_IFDIR) != 0;
#endif
}